

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathIsInf(double val)

{
  int iVar1;
  int iVar2;
  undefined4 local_14;
  double val_local;
  
  iVar2 = 1;
  if ((long)val < 0) {
    iVar2 = -1;
  }
  iVar1 = 0;
  if (ABS(val) == INFINITY) {
    iVar1 = iVar2;
  }
  if (iVar1 == 0) {
    local_14 = 0;
  }
  else {
    local_14 = -1;
    if (0.0 < val) {
      local_14 = 1;
    }
  }
  return local_14;
}

Assistant:

int
xmlXPathIsInf(double val) {
#ifdef isinf
    return isinf(val) ? (val > 0 ? 1 : -1) : 0;
#else
    if (val >= xmlXPathPINF)
        return 1;
    if (val <= -xmlXPathPINF)
        return -1;
    return 0;
#endif
}